

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O2

string * __thiscall
phosg::format_data_abi_cxx11_
          (string *__return_storage_ptr__,phosg *this,iovec *iovs,size_t num_iovs,
          uint64_t start_address,iovec *prev_iovs,size_t num_prev_iovs,uint64_t flags)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  StringWriter w;
  type write_data;
  StringWriter local_88;
  function<void_(const_void_*,_unsigned_long)> local_68;
  _Bind<void_(phosg::StringWriter::*(phosg::StringWriter_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(const_void_*,_unsigned_long)>
  local_48;
  
  paVar1 = &local_88.data.field_2;
  local_88.data._M_string_length = 0;
  local_48._M_f = (offset_in_StringWriter_to_subr)StringWriter::write;
  local_48._8_8_ = 0;
  local_88.data.field_2._M_local_buf[0] = '\0';
  local_48._M_bound_args.
  super__Tuple_impl<0UL,_phosg::StringWriter_*,_std::_Placeholder<1>,_std::_Placeholder<2>_>.
  super__Head_base<0UL,_phosg::StringWriter_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_phosg::StringWriter_*,_std::_Placeholder<1>,_std::_Placeholder<2>_>)
       &local_88;
  local_88.data._M_dataplus._M_p = (pointer)paVar1;
  ::std::function<void(void_const*,unsigned_long)>::
  function<std::_Bind<void(phosg::StringWriter::*(phosg::StringWriter*,std::_Placeholder<1>,std::_Placeholder<2>))(void_const*,unsigned_long)>&,void>
            ((function<void(void_const*,unsigned_long)> *)&local_68,&local_48);
  format_data(&local_68,(iovec *)this,(size_t)iovs,num_iovs,(iovec *)start_address,(size_t)prev_iovs
              ,num_prev_iovs);
  ::std::_Function_base::~_Function_base(&local_68.super__Function_base);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.data._M_dataplus._M_p == paVar1) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_88.data.field_2._M_allocated_capacity._1_7_,
                  local_88.data.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_88.data.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_88.data._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_88.data.field_2._M_allocated_capacity._1_7_,
                  local_88.data.field_2._M_local_buf[0]);
  }
  __return_storage_ptr__->_M_string_length = local_88.data._M_string_length;
  local_88.data._M_string_length = 0;
  local_88.data.field_2._M_local_buf[0] = '\0';
  local_88.data._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::~string((string *)&local_88);
  return __return_storage_ptr__;
}

Assistant:

string format_data(
    const struct iovec* iovs,
    size_t num_iovs,
    uint64_t start_address,
    const struct iovec* prev_iovs,
    size_t num_prev_iovs,
    uint64_t flags) {
  StringWriter w;
  // StringWriter::write is overloaded, so we have to static_cast here to
  // specify which variant should be used
  auto write_data = bind(
      static_cast<void (StringWriter::*)(const void*, size_t)>(&StringWriter::write),
      &w, placeholders::_1, placeholders::_2);
  format_data(write_data, iovs, num_iovs, start_address, prev_iovs, num_prev_iovs, flags);
  return std::move(w.str());
}